

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateServiceMethod
               (MethodDescriptor *method,Printer *printer)

{
  char (*in_RSI) [11];
  MethodDescriptor *in_RDI;
  Printer *unaff_retaddr;
  bool in_stack_00000017;
  Descriptor *in_stack_00000018;
  string local_50 [7];
  undefined1 in_stack_ffffffffffffffb7;
  string *in_stack_ffffffffffffffb8;
  string local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  char (*in_stack_ffffffffffffffe0) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  MethodDescriptor::name_abi_cxx11_(in_RDI);
  UnderscoresToCamelCase(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  MethodDescriptor::input_type((MethodDescriptor *)0x4a6fbb);
  FullClassName<google::protobuf::Descriptor>(in_stack_00000018,in_stack_00000017);
  io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
            (unaff_retaddr,(char *)in_RDI,in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0
             ,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void GenerateServiceMethod(const MethodDescriptor* method,
                           io::Printer* printer) {
  printer->Print(
        "public function ^camel_name^(\\^request_name^ $request);\n\n",
        "camel_name", UnderscoresToCamelCase(method->name(), false),
        "request_name", FullClassName(
          method->input_type(), false)
  );
}